

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_free(archive_write *a)

{
  mtree_writer *mtree_00;
  mtree_writer *mtree;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  if (mtree_00 != (mtree_writer *)0x0) {
    mtree_entry_register_free(mtree_00);
    archive_string_free(&mtree_00->cur_dirstr);
    archive_string_free(&mtree_00->ebuf);
    archive_string_free(&mtree_00->buf);
    attr_counter_set_free(mtree_00);
    free(mtree_00);
    a->format_data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_write_mtree_free(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;

	if (mtree == NULL)
		return (ARCHIVE_OK);

	/* Make sure we dot not leave any entries. */
	mtree_entry_register_free(mtree);
	archive_string_free(&mtree->cur_dirstr);
	archive_string_free(&mtree->ebuf);
	archive_string_free(&mtree->buf);
	attr_counter_set_free(mtree);
	free(mtree);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}